

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadFuncTanh<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>
::val(FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadFuncTanh<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>
      *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
  *pFVar5;
  FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>
  *pFVar6;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *pFVar7;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_> *pFVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  iVar4 = (this->left_->fadexpr_).left_.constant_;
  dVar9 = tanh((((this->left_->fadexpr_).right_)->fadexpr_).expr_.val_);
  pFVar5 = this->right_;
  pFVar6 = (pFVar5->fadexpr_).left_;
  dVar1 = (pFVar6->fadexpr_).left_.constant_;
  pFVar7 = (pFVar6->fadexpr_).right_;
  dVar2 = (pFVar7->fadexpr_).left_.constant_;
  dVar10 = cos((((pFVar7->fadexpr_).right_)->fadexpr_).expr_.val_);
  pFVar8 = (pFVar5->fadexpr_).right_;
  dVar3 = (pFVar8->fadexpr_).left_.constant_;
  dVar11 = sin((((pFVar8->fadexpr_).right_)->fadexpr_).expr_.val_);
  return ((dVar1 - dVar10 * dVar2) - dVar11 * dVar3) * ((double)iVar4 / dVar9);
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}